

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall QDateTimeEdit::setDateTimeRange(QDateTimeEdit *this,QDateTime *min,QDateTime *max)

{
  long *plVar1;
  char cVar2;
  long in_FS_OFFSET;
  QDateTime maximum;
  QDateTime minimum;
  undefined1 *local_80;
  Data local_78;
  QVariant local_70;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  local_78.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::toTimeZone((QTimeZone *)&local_78.s);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  cVar2 = compareThreeWay(min,max);
  if (cVar2 < '\x01') {
    QDateTime::toTimeZone((QTimeZone *)&local_80);
  }
  else {
    QDateTime::QDateTime((QDateTime *)&local_80,(QDateTime *)&local_78.s);
  }
  ::QVariant::QVariant(&local_50,(QDateTime *)&local_78.s);
  ::QVariant::QVariant(&local_70,(QDateTime *)&local_80);
  (**(code **)(*plVar1 + 0xb0))(plVar1,&local_50,&local_70);
  ::QVariant::~QVariant(&local_70);
  ::QVariant::~QVariant(&local_50);
  QDateTime::~QDateTime((QDateTime *)&local_80);
  QDateTime::~QDateTime((QDateTime *)&local_78.s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setDateTimeRange(const QDateTime &min, const QDateTime &max)
{
    Q_D(QDateTimeEdit);
    // FIXME: does none of the range checks applied to setMin/setMax methods !
    const QDateTime minimum = min.toTimeZone(d->timeZone);
    const QDateTime maximum = (min > max ? minimum : max.toTimeZone(d->timeZone));
    d->setRange(minimum, maximum);
}